

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_addmul_v_s256_129(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  int iVar1;
  block_t *Ablock;
  word *vptr;
  long lVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  
  auVar3 = vpbroadcastq_avx512vl();
  iVar1 = 2;
  auVar3 = vpternlogq_avx512vl(auVar3,*(undefined1 (*) [32])c->w64,*(undefined1 (*) [32])A[0x3f].w64
                               ,0x6c);
  auVar7 = ZEXT3264(auVar3);
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  do {
    lVar2 = 0x800;
    do {
      auVar3 = vpbroadcastq_avx512vl();
      auVar3 = vpternlogq_avx512vl(auVar7._0_32_,auVar3,*(undefined1 (*) [32])((long)A->w64 + lVar2)
                                   ,0x78);
      auVar4 = vpbroadcastq_avx512vl();
      auVar5 = vpbroadcastq_avx512vl();
      auVar5 = vpternlogq_avx512vl(auVar8._0_32_,auVar5,
                                   *(undefined1 (*) [32])((long)A[1].w64 + lVar2),0x78);
      auVar6 = vpbroadcastq_avx512vl();
      auVar4 = vpternlogq_avx512vl(auVar5,auVar4,*(undefined1 (*) [32])((long)A[3].w64 + lVar2),0x78
                                  );
      auVar8 = ZEXT3264(auVar4);
      auVar3 = vpternlogq_avx512vl(auVar3,auVar6,*(undefined1 (*) [32])((long)A[2].w64 + lVar2),0x78
                                  );
      auVar7 = ZEXT3264(auVar3);
      lVar2 = lVar2 + 0x80;
    } while ((int)lVar2 != 0x1000);
    iVar1 = iVar1 + -1;
    A = A + 0x40;
  } while (iVar1 != 0);
  *(undefined1 (*) [32])c->w64 = auVar3 ^ auVar4;
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_addmul_v_s256_129(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word256 cval[2] = {mm256_load(cblock->w64), mm256_zero};
  {
    cval[0] =
        mm256_xor_mask(cval[0], mm256_load(Ablock[63].w64), mm256_compute_mask((*vptr) >> 63, 0));
    vptr++;
    Ablock += 64;
  }
  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 4, idx >>= 4, Ablock += 4) {
      cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask(idx, 0));
      cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[1].w64), mm256_compute_mask(idx, 1));
      cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[2].w64), mm256_compute_mask(idx, 2));
      cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[3].w64), mm256_compute_mask(idx, 3));
    }
  }
  mm256_store(cblock->w64, mm256_xor(cval[0], cval[1]));
}